

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O1

void deqp::gles3::Functional::anon_unknown_0::verifyError
               (TestContext *testCtx,Functions *gl,GLenum expected)

{
  ostringstream *this;
  undefined4 in_register_00000014;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  local_1c0.m_value = (*gl->getError)(testCtx,gl,CONCAT44(in_register_00000014,expected));
  if (local_1c0.m_value != 0) {
    local_1a0._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// ERROR: expected ",0x13);
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = 0;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; got ",6);
    local_1c0.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_128);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid error");
    }
  }
  return;
}

Assistant:

void verifyError (tcu::TestContext& testCtx, const glw::Functions& gl, GLenum expected)
{
	deUint32 got = gl.getError();
	if (got != expected)
	{
		testCtx.getLog() << tcu::TestLog::Message << "// ERROR: expected " << glu::getErrorStr(expected) << "; got " << glu::getErrorStr(got) << tcu::TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid error");
	}
}